

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O1

NBestGenerator * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::nbest_generator
          (Allocator<mecab_node_t,_mecab_path_t> *this)

{
  NBestGenerator *pNVar1;
  
  if ((this->nbest_generator_).ptr_ == (NBestGenerator *)0x0) {
    pNVar1 = (NBestGenerator *)operator_new(0x60);
    pNVar1->_vptr_NBestGenerator = (_func_int **)&PTR__NBestGenerator_00172ae8;
    (pNVar1->agenda_).c.
    super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar1->agenda_).c.
    super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar1->agenda_).c.
    super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pNVar1->freelist_)._vptr_FreeList = (_func_int **)&PTR__FreeList_00172b18;
    (pNVar1->freelist_).freeList.
    super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar1->freelist_).freeList.
    super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar1->freelist_).freeList.
    super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pNVar1->freelist_).pi_ = 0;
    (pNVar1->freelist_).li_ = 0;
    (pNVar1->freelist_).size = 0x200;
    (this->nbest_generator_).ptr_ = pNVar1;
  }
  return (this->nbest_generator_).ptr_;
}

Assistant:

NBestGenerator *nbest_generator() {
    if (!nbest_generator_.get()) {
      nbest_generator_.reset(new NBestGenerator);
    }
    return nbest_generator_.get();
  }